

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPagesToPageInContext
          (PDFDocumentHandler *this,PDFPage *inPage,PDFPageRange *inPageRange,
          ObjectIDTypeList *inCopyAdditionalObjects)

{
  _Rb_tree_header *p_Var1;
  EStatusCode EVar2;
  Trace *pTVar3;
  _Base_ptr p_Var4;
  _List_node_base *p_Var5;
  unsigned_long uVar6;
  _Rb_tree_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  ulong uVar10;
  bool bVar11;
  
  p_Var4 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mExtenders)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    EVar2 = eSuccess;
  }
  else {
    do {
      EVar2 = (**(code **)(**(long **)(p_Var4 + 1) + 0x48))
                        (*(long **)(p_Var4 + 1),this->mObjectsContext,this->mDocumentContext,this);
      if (EVar2 != eSuccess) {
        pTVar3 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar3,
                          "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page."
                         );
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (((_Rb_tree_header *)p_Var4 != p_Var1) && (EVar2 == eSuccess));
  }
  if ((inCopyAdditionalObjects->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl._M_node._M_size != 0) {
    EVar2 = WriteNewObjects(this,inCopyAdditionalObjects);
    if (EVar2 != eSuccess) {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects"
                       );
      goto LAB_001cb75b;
    }
    EVar2 = eSuccess;
  }
  if (inPageRange->mType == eRangeTypeAll) {
    uVar6 = PDFParser::GetPagesCount(this->mParser);
    if ((EVar2 == eSuccess) && (uVar6 != 0)) {
      uVar10 = 1;
      do {
        EVar2 = MergePDFPageForPage(this,inPage,uVar10 - 1);
        if (EVar2 != eSuccess) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,
                            "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld",
                            uVar10 - 1);
        }
        uVar6 = PDFParser::GetPagesCount(this->mParser);
      } while ((EVar2 == eSuccess) && (bVar11 = uVar10 < uVar6, uVar10 = uVar10 + 1, bVar11));
    }
  }
  else {
    p_Var9 = (inPageRange->mSpecificRanges).
             super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (EVar2 == eSuccess && p_Var9 != (_List_node_base *)&inPageRange->mSpecificRanges) {
      do {
        p_Var8 = p_Var9[1]._M_prev;
        if ((p_Var8 < p_Var9[1]._M_next) ||
           (p_Var5 = (_List_node_base *)PDFParser::GetPagesCount(this->mParser), p_Var5 <= p_Var8))
        {
          pTVar3 = Trace::DefaultTrace();
          p_Var8 = p_Var9[1]._M_next;
          p_Var5 = p_Var9[1]._M_prev;
          uVar6 = PDFParser::GetPagesCount(this->mParser);
          Trace::TraceToLog(pTVar3,
                            "PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld"
                            ,p_Var8,p_Var5,uVar6);
          EVar2 = eFailure;
        }
        else {
          p_Var8 = p_Var9[1]._M_next;
          EVar2 = eSuccess;
          if (p_Var8 <= p_Var9[1]._M_prev) {
            do {
              EVar2 = MergePDFPageForPage(this,inPage,(unsigned_long)p_Var8);
              if (EVar2 != eSuccess) {
                pTVar3 = Trace::DefaultTrace();
                Trace::TraceToLog(pTVar3,
                                  "PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld"
                                  ,p_Var8);
                break;
              }
              p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
            } while (p_Var8 <= p_Var9[1]._M_prev);
          }
        }
      } while ((EVar2 == eSuccess) &&
              (p_Var9 = p_Var9->_M_next, p_Var9 != (_List_node_base *)&inPageRange->mSpecificRanges)
              );
    }
  }
LAB_001cb75b:
  p_Var7 = (this->mExtenders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var7 != p_Var1 && (EVar2 == eSuccess))) {
    EVar2 = (**(code **)(**(long **)((long)p_Var7 + 0x20) + 0x80))
                      (*(long **)((long)p_Var7 + 0x20),this->mObjectsContext,this->mDocumentContext,
                       this);
    if (EVar2 != eSuccess) {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy."
                       );
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  StopCopyingContext(this);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPagesToPageInContext(PDFPage* inPage,
															const PDFPageRange& inPageRange,
															const ObjectIDTypeList& inCopyAdditionalObjects)
{
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		IDocumentContextExtenderSet::iterator it = mExtenders.begin();
		for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
		{
			status = (*it)->OnPDFParsingComplete(mObjectsContext,mDocumentContext,this);
			if(status != PDFHummus::eSuccess)
				TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure after parsing page.");
		}

	// copy additional objects prior to pages, so we have them ready at page merging
		if(inCopyAdditionalObjects.size() > 0)
		{
			status = WriteNewObjects(inCopyAdditionalObjects);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("PDFDocumentHandler::MergePDFPagesToPage, failed copying additional objects");
				break;
			}
		}

		if(PDFPageRange::eRangeTypeAll == inPageRange.mType)
		{
			for(unsigned long i=0; i < mParser->GetPagesCount() && PDFHummus::eSuccess == status; ++i)
			{
				status = MergePDFPageForPage(inPage,i);
				if(status != PDFHummus::eSuccess)
					TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
			}
		}
		else
		{
			// eRangeTypeSpecific
			ULongAndULongList::const_iterator it = inPageRange.mSpecificRanges.begin();
			for(; it != inPageRange.mSpecificRanges.end() && PDFHummus::eSuccess == status;++it)
			{
				if(it->first <= it->second && it->second < mParser->GetPagesCount())
				{
					for(unsigned long i=it->first; i <= it->second && PDFHummus::eSuccess == status; ++i)
					{
						status = MergePDFPageForPage(inPage,i);
						if(status != PDFHummus::eSuccess)
							TRACE_LOG1("PDFDocumentHandler::MergePDFPagesToPage, failed to embed page %ld", i);
					}
				}
				else
				{
					TRACE_LOG3("PDFDocumentHandler::MergePDFPagesToPage, range mismatch. first = %ld, second = %ld, PDF page count = %ld", 
						it->first,
						it->second,
						mParser->GetPagesCount());
					status = PDFHummus::eFailure;
				}
			}
		}


	}while(false);

	IDocumentContextExtenderSet::iterator it = mExtenders.begin();
	for(; it != mExtenders.end() && PDFHummus::eSuccess == status; ++it)
	{
		status = (*it)->OnPDFCopyingComplete(mObjectsContext,mDocumentContext,this);
		if(status != PDFHummus::eSuccess)
			TRACE_LOG("DocumentContext::MergePDFPagesToPage, unexpected failure. extender declared failure before finalizing copy.");
	}

	StopCopyingContext();

	return status;

}